

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.c
# Opt level: O3

void init_threads(void)

{
  int iVar1;
  undefined1 local_48 [8];
  uv_sem_t sem;
  char *val;
  undefined1 local_18 [4];
  uint i;
  uv_thread_options_t config;
  
  nthreads = 4;
  sem._24_8_ = getenv("UV_THREADPOOL_SIZE");
  if ((char *)sem._24_8_ != (char *)0x0) {
    nthreads = atoi((char *)sem._24_8_);
  }
  if (nthreads == 0) {
    nthreads = 1;
  }
  if (0x400 < nthreads) {
    nthreads = 0x400;
  }
  threads = default_threads;
  if ((4 < nthreads) &&
     (threads = (uv_thread_t *)uv__malloc((ulong)nthreads << 3), threads == (uv_thread_t *)0x0)) {
    nthreads = 4;
    threads = default_threads;
  }
  iVar1 = uv_cond_init(&cond);
  if (iVar1 != 0) {
    abort();
  }
  iVar1 = uv_mutex_init(&mutex);
  if (iVar1 != 0) {
    abort();
  }
  uv__queue_init(&wq);
  uv__queue_init(&slow_io_pending_wq);
  uv__queue_init(&run_slow_work_message);
  iVar1 = uv_sem_init((uv_sem_t *)local_48,0);
  if (iVar1 == 0) {
    local_18 = (undefined1  [4])0x1;
    config.flags = 0x800000;
    config._4_4_ = 0;
    val._4_4_ = 0;
    while( true ) {
      if (nthreads <= val._4_4_) {
        for (val._4_4_ = 0; val._4_4_ < nthreads; val._4_4_ = val._4_4_ + 1) {
          uv_sem_wait((uv_sem_t *)local_48);
        }
        uv_sem_destroy((uv_sem_t *)local_48);
        return;
      }
      iVar1 = uv_thread_create_ex(threads + val._4_4_,(uv_thread_options_t *)local_18,worker,
                                  local_48);
      if (iVar1 != 0) break;
      val._4_4_ = val._4_4_ + 1;
    }
    abort();
  }
  abort();
}

Assistant:

static void init_threads(void) {
  uv_thread_options_t config;
  unsigned int i;
  const char* val;
  uv_sem_t sem;

  nthreads = ARRAY_SIZE(default_threads);
  val = getenv("UV_THREADPOOL_SIZE");
  if (val != NULL)
    nthreads = atoi(val);
  if (nthreads == 0)
    nthreads = 1;
  if (nthreads > MAX_THREADPOOL_SIZE)
    nthreads = MAX_THREADPOOL_SIZE;

  threads = default_threads;
  if (nthreads > ARRAY_SIZE(default_threads)) {
    threads = uv__malloc(nthreads * sizeof(threads[0]));
    if (threads == NULL) {
      nthreads = ARRAY_SIZE(default_threads);
      threads = default_threads;
    }
  }

  if (uv_cond_init(&cond))
    abort();

  if (uv_mutex_init(&mutex))
    abort();

  uv__queue_init(&wq);
  uv__queue_init(&slow_io_pending_wq);
  uv__queue_init(&run_slow_work_message);

  if (uv_sem_init(&sem, 0))
    abort();

  config.flags = UV_THREAD_HAS_STACK_SIZE;
  config.stack_size = 8u << 20;  /* 8 MB */

  for (i = 0; i < nthreads; i++)
    if (uv_thread_create_ex(threads + i, &config, worker, &sem))
      abort();

  for (i = 0; i < nthreads; i++)
    uv_sem_wait(&sem);

  uv_sem_destroy(&sem);
}